

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaDup.c
# Opt level: O1

Gia_Man_t * Gia_ManDupMarked(Gia_Man_t *p)

{
  uint uVar1;
  char *pcVar2;
  Gia_Obj_t *pGVar3;
  undefined8 uVar4;
  uint uVar5;
  int iVar6;
  int iVar7;
  Gia_Man_t *p_00;
  uint *puVar8;
  size_t sVar9;
  char *pcVar10;
  Gia_Obj_t *pGVar11;
  Gia_Obj_t *pGVar12;
  Gia_Rpr_t *pGVar13;
  int *piVar14;
  uint uVar15;
  uint uVar16;
  long lVar17;
  ulong uVar18;
  int iVar19;
  ulong uVar20;
  uint uVar21;
  uint uVar22;
  ulong uVar23;
  uint uVar24;
  uint uVar25;
  uint uVar26;
  long lVar27;
  int local_5c;
  
  if ((long)p->nObjs < 1) {
LAB_006747c2:
    iVar19 = 0;
  }
  else {
    lVar17 = 0;
    iVar19 = 0;
    do {
      if (p->pObjs == (Gia_Obj_t *)0x0) goto LAB_006747c2;
      iVar19 = iVar19 + (uint)((*(uint *)(&p->pObjs->field_0x0 + lVar17) >> 0x1e & 1) != 0);
      lVar17 = lVar17 + 0xc;
    } while ((long)p->nObjs * 0xc != lVar17);
  }
  Gia_ManFillValue(p);
  p_00 = Gia_ManStart(p->nObjs - iVar19);
  if (p->pMuxes != (uint *)0x0) {
    puVar8 = (uint *)calloc((long)p_00->nObjsAlloc,4);
    p_00->pMuxes = puVar8;
  }
  p_00->nConstrs = p->nConstrs;
  pcVar2 = p->pName;
  if (pcVar2 == (char *)0x0) {
    pcVar10 = (char *)0x0;
  }
  else {
    sVar9 = strlen(pcVar2);
    pcVar10 = (char *)malloc(sVar9 + 1);
    strcpy(pcVar10,pcVar2);
  }
  p_00->pName = pcVar10;
  pcVar2 = p->pSpec;
  if (pcVar2 == (char *)0x0) {
    pcVar10 = (char *)0x0;
  }
  else {
    sVar9 = strlen(pcVar2);
    pcVar10 = (char *)malloc(sVar9 + 1);
    strcpy(pcVar10,pcVar2);
  }
  iVar19 = 0;
  p_00->pSpec = pcVar10;
  p->pObjs->Value = 0;
  uVar18 = (ulong)(uint)p->nObjs;
  local_5c = 0;
  if (1 < p->nObjs) {
    local_5c = 0;
    lVar27 = 1;
    lVar17 = 5;
    iVar19 = 0;
    do {
      pGVar3 = p->pObjs;
      uVar20 = *(ulong *)((long)pGVar3 + lVar17 * 4 + -8);
      uVar21 = (uint)uVar20;
      uVar22 = uVar21 & 0x1fffffff;
      uVar26 = (uint)(uVar20 >> 0x20);
      uVar24 = uVar26 & 0x1fffffff;
      if ((uVar21 >> 0x1e & 1) == 0) {
        uVar5 = uVar21 & 0x1fffffff;
        if ((((int)uVar21 < 0) || (uVar22 == 0x1fffffff)) || (uVar22 != uVar24)) {
          if (uVar5 == 0x1fffffff || (int)uVar21 < 0) {
            if ((uVar21 & 0x9fffffff) == 0x9fffffff) {
              pGVar12 = Gia_ManAppendObj(p_00);
              uVar18 = *(ulong *)pGVar12;
              *(ulong *)pGVar12 = uVar18 | 0x9fffffff;
              *(ulong *)pGVar12 =
                   uVar18 & 0xe0000000ffffffff | 0x9fffffff |
                   (ulong)(p_00->vCis->nSize & 0x1fffffff) << 0x20;
              pGVar11 = p_00->pObjs;
              if ((pGVar12 < pGVar11) || (pGVar11 + p_00->nObjs <= pGVar12)) {
LAB_0067538f:
                __assert_fail("p->pObjs <= pObj && pObj < p->pObjs + p->nObjs",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/gia.h"
                              ,0x1ab,"int Gia_ObjId(Gia_Man_t *, Gia_Obj_t *)");
              }
              Vec_IntPush(p_00->vCis,
                          (int)((ulong)((long)pGVar12 - (long)pGVar11) >> 2) * -0x55555555);
              pGVar11 = p_00->pObjs;
              if ((pGVar12 < pGVar11) || (pGVar11 + p_00->nObjs <= pGVar12)) goto LAB_0067538f;
              *(int *)(&pGVar3->field_0x0 + lVar17 * 4) =
                   (int)((ulong)((long)pGVar12 - (long)pGVar11) >> 2) * 0x55555556;
              uVar4 = *(undefined8 *)((long)pGVar3 + lVar17 * 4 + -8);
              uVar26 = 0;
              if (((uint)uVar4 & 0x9fffffff) == 0x9fffffff) {
                uVar26 = (uint)(p->vCis->nSize - p->nRegs <=
                               (int)((uint)((ulong)uVar4 >> 0x20) & 0x1fffffff));
              }
              iVar19 = iVar19 + uVar26;
            }
            else if ((int)uVar21 < 0 && uVar5 != 0x1fffffff) {
              uVar26 = *(uint *)((long)pGVar3 + lVar17 * 4 + (ulong)(uVar5 << 2) * -3);
              if ((int)uVar26 < 0) goto LAB_006753ae;
              iVar6 = Gia_ManAppendCo(p_00,uVar26 ^ uVar21 >> 0x1d & 1);
              *(int *)(&pGVar3->field_0x0 + lVar17 * 4) = iVar6;
              uVar4 = *(undefined8 *)((long)pGVar3 + lVar17 * 4 + -8);
              uVar26 = (uint)uVar4;
              uVar22 = 0;
              if ((~uVar26 & 0x1fffffff) != 0 && (int)uVar26 < 0) {
                uVar22 = (uint)(p->vCos->nSize - p->nRegs <=
                               (int)((uint)((ulong)uVar4 >> 0x20) & 0x1fffffff));
              }
              local_5c = local_5c + uVar22;
            }
          }
          else if (uVar22 < uVar24) {
            uVar22 = *(uint *)((long)pGVar3 + lVar17 * 4 + (ulong)(uVar5 << 2) * -3);
            if (((int)uVar22 < 0) ||
               (uVar24 = *(uint *)((long)pGVar3 +
                                  lVar17 * 4 + (ulong)((uVar26 & 0x1fffffff) << 2) * -3),
               (int)uVar24 < 0)) goto LAB_006753ae;
            pGVar11 = Gia_ManAppendObj(p_00);
            uVar21 = uVar22 >> 1;
            iVar6 = p_00->nObjs;
            if (iVar6 <= (int)uVar21) {
              __assert_fail("iLit0 >= 0 && Abc_Lit2Var(iLit0) < Gia_ManObjNum(p)",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/gia.h"
                            ,0x296,"int Gia_ManAppendXorReal(Gia_Man_t *, int, int)");
            }
            uVar5 = uVar24 >> 1;
            if (iVar6 <= (int)uVar5) {
              __assert_fail("iLit1 >= 0 && Abc_Lit2Var(iLit1) < Gia_ManObjNum(p)",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/gia.h"
                            ,0x297,"int Gia_ManAppendXorReal(Gia_Man_t *, int, int)");
            }
            if (uVar21 == uVar5) {
              __assert_fail("Abc_Lit2Var(iLit0) != Abc_Lit2Var(iLit1)",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/gia.h"
                            ,0x298,"int Gia_ManAppendXorReal(Gia_Man_t *, int, int)");
            }
            if (((uint)(uVar20 >> 0x1d) & 7) != (uVar22 & 1)) {
              __assert_fail("!Abc_LitIsCompl(iLit0)",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/gia.h"
                            ,0x299,"int Gia_ManAppendXorReal(Gia_Man_t *, int, int)");
            }
            if (((uVar24 ^ uVar26 >> 0x1d) & 1) != 0) {
              __assert_fail("!Abc_LitIsCompl(iLit1)",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/gia.h"
                            ,0x29a,"int Gia_ManAppendXorReal(Gia_Man_t *, int, int)");
            }
            iVar7 = (int)pGVar11;
            if (uVar5 < uVar21) {
              pGVar12 = p_00->pObjs;
              if ((pGVar11 < pGVar12) || (pGVar12 + iVar6 <= pGVar11)) goto LAB_0067538f;
              uVar18 = *(ulong *)pGVar11 & 0xffffffffc0000000 |
                       (ulong)(((uint)(iVar7 - (int)pGVar12) >> 2) * -0x55555555 - uVar21 &
                              0x1fffffff);
              *(ulong *)pGVar11 = uVar18;
              pGVar12 = p_00->pObjs;
              if ((pGVar11 < pGVar12) || (pGVar12 + p_00->nObjs <= pGVar11)) goto LAB_0067538f;
              uVar23 = (ulong)(((uint)(iVar7 - (int)pGVar12) >> 2) * -0x55555555 - uVar5 &
                              0x1fffffff) << 0x20;
              uVar20 = 0xe0000000dfffffff;
            }
            else {
              pGVar12 = p_00->pObjs;
              if ((pGVar11 < pGVar12) || (pGVar12 + iVar6 <= pGVar11)) goto LAB_0067538f;
              uVar18 = *(ulong *)pGVar11 & 0xc0000000ffffffff |
                       (ulong)(((uint)(iVar7 - (int)pGVar12) >> 2) * -0x55555555 - uVar21 &
                              0x1fffffff) << 0x20;
              *(ulong *)pGVar11 = uVar18;
              pGVar12 = p_00->pObjs;
              if ((pGVar11 < pGVar12) || (pGVar12 + p_00->nObjs <= pGVar11)) goto LAB_0067538f;
              uVar23 = (ulong)(((uint)(iVar7 - (int)pGVar12) >> 2) * -0x55555555 - uVar5 &
                              0x1fffffff);
              uVar20 = 0xdfffffffe0000000;
            }
            *(ulong *)pGVar11 = uVar18 & uVar20 & 0xdfffffffdfffffff | uVar23;
            p_00->nXors = p_00->nXors + 1;
            pGVar12 = p_00->pObjs;
            if ((pGVar11 < pGVar12) || (pGVar12 + p_00->nObjs <= pGVar11)) goto LAB_0067538f;
            *(int *)(&pGVar3->field_0x0 + lVar17 * 4) =
                 (int)((ulong)((long)pGVar11 - (long)pGVar12) >> 2) * 0x55555556;
          }
          else {
            if ((int)uVar18 <= lVar27) goto LAB_0067538f;
            puVar8 = p->pMuxes;
            if ((puVar8 == (uint *)0x0) || (puVar8[lVar27] == 0)) {
              uVar22 = *(uint *)((long)pGVar3 + lVar17 * 4 + (ulong)(uVar5 << 2) * -3);
              if (((int)uVar22 < 0) ||
                 (uVar24 = *(uint *)((long)pGVar3 +
                                    lVar17 * 4 + (ulong)((uVar26 & 0x1fffffff) << 2) * -3),
                 (int)uVar24 < 0)) goto LAB_006753ae;
              iVar6 = Gia_ManAppendAnd(p_00,uVar22 ^ (uint)(uVar20 >> 0x1d) & 7,
                                       uVar24 ^ uVar26 >> 0x1d & 1);
              goto LAB_00674938;
            }
            uVar22 = puVar8[lVar27];
            if ((int)uVar22 < 0) goto LAB_006753cd;
            if ((int)uVar18 <= (int)(uVar22 >> 1)) goto LAB_0067540b;
            uVar24 = pGVar3[uVar22 >> 1].Value;
            if ((((int)uVar24 < 0) ||
                (uVar1 = *(uint *)((long)pGVar3 +
                                  lVar17 * 4 + (ulong)((uVar26 & 0x1fffffff) << 2) * -3),
                (int)uVar1 < 0)) ||
               (uVar5 = *(uint *)((long)pGVar3 + lVar17 * 4 + (ulong)(uVar5 << 2) * -3),
               (int)uVar5 < 0)) {
LAB_006753ae:
              __assert_fail("Lit >= 0",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/util/abc_global.h"
                            ,0x10f,"int Abc_LitNotCond(int, int)");
            }
            pGVar11 = Gia_ManAppendObj(p_00);
            if (p_00->pMuxes == (uint *)0x0) {
              __assert_fail("p->pMuxes != NULL",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/gia.h"
                            ,0x2af,"int Gia_ManAppendMuxReal(Gia_Man_t *, int, int, int)");
            }
            uVar16 = uVar5 >> 1;
            iVar6 = p_00->nObjs;
            if (iVar6 <= (int)uVar16) {
              __assert_fail("iLit0 >= 0 && Abc_Lit2Var(iLit0) < Gia_ManObjNum(p)",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/gia.h"
                            ,0x2b0,"int Gia_ManAppendMuxReal(Gia_Man_t *, int, int, int)");
            }
            uVar15 = uVar1 >> 1;
            if (iVar6 <= (int)uVar15) {
              __assert_fail("iLit1 >= 0 && Abc_Lit2Var(iLit1) < Gia_ManObjNum(p)",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/gia.h"
                            ,0x2b1,"int Gia_ManAppendMuxReal(Gia_Man_t *, int, int, int)");
            }
            uVar25 = uVar24 >> 1;
            if (iVar6 <= (int)uVar25) {
              __assert_fail("iLitC >= 0 && Abc_Lit2Var(iLitC) < Gia_ManObjNum(p)",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/gia.h"
                            ,0x2b2,"int Gia_ManAppendMuxReal(Gia_Man_t *, int, int, int)");
            }
            if (uVar16 == uVar15) {
              __assert_fail("Abc_Lit2Var(iLit0) != Abc_Lit2Var(iLit1)",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/gia.h"
                            ,0x2b3,"int Gia_ManAppendMuxReal(Gia_Man_t *, int, int, int)");
            }
            if (uVar25 == uVar16) {
              __assert_fail("Abc_Lit2Var(iLitC) != Abc_Lit2Var(iLit0)",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/gia.h"
                            ,0x2b4,"int Gia_ManAppendMuxReal(Gia_Man_t *, int, int, int)");
            }
            if (uVar25 == uVar15) {
              __assert_fail("Abc_Lit2Var(iLitC) != Abc_Lit2Var(iLit1)",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/gia.h"
                            ,0x2b5,"int Gia_ManAppendMuxReal(Gia_Man_t *, int, int, int)");
            }
            uVar26 = (uVar1 ^ uVar26 >> 0x1d) & 1;
            if ((uVar26 != 0) && (p_00->pHTable != (int *)0x0)) {
              __assert_fail("!p->pHTable || !Abc_LitIsCompl(iLit1)",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/gia.h"
                            ,0x2b6,"int Gia_ManAppendMuxReal(Gia_Man_t *, int, int, int)");
            }
            uVar24 = uVar24 ^ uVar22 & 1;
            uVar5 = uVar5 ^ uVar21 >> 0x1d;
            iVar7 = (int)pGVar11;
            if (uVar16 < uVar15) {
              pGVar12 = p_00->pObjs;
              if ((pGVar11 < pGVar12) || (pGVar12 + iVar6 <= pGVar11)) goto LAB_0067538f;
              uVar18 = *(ulong *)pGVar11;
              uVar20 = (ulong)((uVar5 & 1) << 0x1d |
                              ((uint)(iVar7 - (int)pGVar12) >> 2) * -0x55555555 - uVar16 &
                              0x1fffffff);
              *(ulong *)pGVar11 = uVar20 | uVar18 & 0xffffffffc0000000;
              pGVar12 = p_00->pObjs;
              if ((pGVar11 < pGVar12) || (pGVar12 + p_00->nObjs <= pGVar11)) goto LAB_0067538f;
              *(ulong *)pGVar11 =
                   (ulong)uVar26 << 0x3d |
                   (ulong)(((uint)(iVar7 - (int)pGVar12) >> 2) * -0x55555555 - uVar15 & 0x1fffffff)
                   << 0x20 | uVar20 | uVar18 & 0xc0000000c0000000;
              pGVar12 = p_00->pObjs;
              if ((pGVar11 < pGVar12) || (pGVar12 + p_00->nObjs <= pGVar11)) goto LAB_0067538f;
            }
            else {
              pGVar12 = p_00->pObjs;
              if ((pGVar11 < pGVar12) || (pGVar12 + iVar6 <= pGVar11)) goto LAB_0067538f;
              uVar20 = (ulong)(((uint)(iVar7 - (int)pGVar12) >> 2) * -0x55555555 - uVar16 &
                              0x1fffffff) << 0x20;
              uVar18 = *(ulong *)pGVar11;
              uVar23 = (ulong)(uVar5 & 1) << 0x3d;
              *(ulong *)pGVar11 = uVar23 | uVar18 & 0xc0000000ffffffff | uVar20;
              pGVar12 = p_00->pObjs;
              if ((pGVar11 < pGVar12) || (pGVar12 + p_00->nObjs <= pGVar11)) goto LAB_0067538f;
              *(ulong *)pGVar11 =
                   (ulong)(uVar26 << 0x1d) | uVar23 | uVar18 & 0xc0000000c0000000 | uVar20 |
                   (ulong)(((uint)(iVar7 - (int)pGVar12) >> 2) * -0x55555555 - uVar15 & 0x1fffffff);
              pGVar12 = p_00->pObjs;
              if ((pGVar11 < pGVar12) || (pGVar12 + p_00->nObjs <= pGVar11)) goto LAB_0067538f;
              uVar24 = uVar24 ^ 1;
            }
            p_00->pMuxes[(int)((ulong)((long)pGVar11 - (long)pGVar12) >> 2) * -0x55555555] = uVar24;
            p_00->nMuxes = p_00->nMuxes + 1;
            pGVar12 = p_00->pObjs;
            if ((pGVar11 < pGVar12) || (pGVar12 + p_00->nObjs <= pGVar11)) goto LAB_0067538f;
            *(int *)(&pGVar3->field_0x0 + lVar17 * 4) =
                 (int)((ulong)((long)pGVar11 - (long)pGVar12) >> 2) * 0x55555556;
          }
        }
        else {
          uVar26 = *(uint *)((long)pGVar3 + lVar17 * 4 + (ulong)(uVar5 << 2) * -3);
          if ((int)uVar26 < 0) goto LAB_006753ae;
          iVar6 = Gia_ManAppendBuf(p_00,uVar26 ^ uVar21 >> 0x1d);
LAB_00674938:
          *(int *)(&pGVar3->field_0x0 + lVar17 * 4) = iVar6;
        }
      }
      else {
        if (((-1 < (int)uVar21) && (uVar22 != 0x1fffffff)) && (uVar22 == uVar24)) {
          __assert_fail("!Gia_ObjIsBuf(pObj)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/giaDup.c"
                        ,0x42b,"Gia_Man_t *Gia_ManDupMarked(Gia_Man_t *)");
        }
        *(ulong *)((long)pGVar3 + lVar17 * 4 + -8) = uVar20 & 0xffffffffbfffffff;
      }
      lVar27 = lVar27 + 1;
      uVar18 = (ulong)p->nObjs;
      lVar17 = lVar17 + 3;
    } while (lVar27 < (long)uVar18);
  }
  if (p_00->nObjsAlloc != p_00->nObjs) {
    __assert_fail("pNew->nObjsAlloc == pNew->nObjs",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/giaDup.c"
                  ,0x446,"Gia_Man_t *Gia_ManDupMarked(Gia_Man_t *)");
  }
  if (iVar19 != local_5c) {
    __assert_fail("nRos == nRis",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/giaDup.c"
                  ,0x447,"Gia_Man_t *Gia_ManDupMarked(Gia_Man_t *)");
  }
  Gia_ManSetRegNum(p_00,iVar19);
  if ((p->pReprs != (Gia_Rpr_t *)0x0) && (p->pNexts != (int *)0x0)) {
    pGVar13 = (Gia_Rpr_t *)calloc((long)p_00->nObjs,4);
    p_00->pReprs = pGVar13;
    if (0 < p->nObjs) {
      lVar17 = 0;
      do {
        p_00->pReprs[lVar17] = (Gia_Rpr_t)((uint)p_00->pReprs[lVar17] | 0xfffffff);
        lVar17 = lVar17 + 1;
      } while (lVar17 < p->nObjs);
    }
    uVar18 = (ulong)(uint)p->nObjs;
    if (1 < p->nObjs) {
      lVar17 = 1;
      lVar27 = 5;
      do {
        pGVar3 = p->pObjs;
        uVar26 = *(uint *)(&pGVar3->field_0x0 + lVar27 * 4);
        if (uVar26 != 0xffffffff) {
          uVar20 = (ulong)(uint)p->pReprs[lVar17] & 0xfffffff;
          if (uVar20 == 0xfffffff) {
            pGVar11 = (Gia_Obj_t *)0x0;
          }
          else {
            if ((int)uVar18 <= (int)uVar20) goto LAB_0067540b;
            pGVar11 = pGVar3 + uVar20;
          }
          if ((pGVar11 != (Gia_Obj_t *)0x0) && (uVar22 = pGVar11->Value, uVar22 != 0xffffffff)) {
            uVar4 = *(undefined8 *)((long)pGVar3 + lVar27 * 4 + -8);
            uVar24 = (uint)uVar4;
            if ((-1 < (int)uVar24) &&
               ((uVar24 = uVar24 & 0x1fffffff, uVar24 != 0x1fffffff &&
                (uVar24 == ((uint)((ulong)uVar4 >> 0x20) & 0x1fffffff))))) {
              __assert_fail("!Gia_ObjIsBuf(pObj)",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/giaDup.c"
                            ,0x458,"Gia_Man_t *Gia_ManDupMarked(Gia_Man_t *)");
            }
            if (((int)uVar26 < 0) || ((int)uVar22 < 0)) goto LAB_006753cd;
            uVar26 = uVar26 >> 1;
            uVar22 = uVar22 >> 1;
            if (uVar26 != uVar22) {
              if ((uVar22 != 0xfffffff) && (uVar26 <= uVar22)) {
                __assert_fail("Num == GIA_VOID || Num < Id",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/gia.h"
                              ,0x38c,"void Gia_ObjSetRepr(Gia_Man_t *, int, int)");
              }
              p_00->pReprs[uVar26] =
                   (Gia_Rpr_t)((uint)p_00->pReprs[uVar26] & 0xf0000000 | uVar22 & 0xfffffff);
            }
          }
        }
        lVar17 = lVar17 + 1;
        uVar18 = (ulong)p->nObjs;
        lVar27 = lVar27 + 3;
      } while (lVar17 < (long)uVar18);
    }
    piVar14 = Gia_ManDeriveNexts(p_00);
    p_00->pNexts = piVar14;
  }
  if (p->pSibls != (int *)0x0) {
    piVar14 = (int *)calloc((long)p_00->nObjs,4);
    p_00->pSibls = piVar14;
    uVar26 = p->nObjs;
    if (1 < (long)(int)uVar26) {
      pGVar3 = p->pObjs;
      puVar8 = &pGVar3[1].Value;
      lVar17 = 1;
      do {
        uVar22 = *puVar8;
        if (uVar22 != 0xffffffff) {
          if (p->pSibls == (int *)0x0) {
LAB_00675316:
            pGVar11 = (Gia_Obj_t *)0x0;
          }
          else {
            uVar24 = p->pSibls[lVar17];
            if ((ulong)uVar24 == 0) goto LAB_00675316;
            if (uVar26 <= uVar24) {
LAB_0067540b:
              __assert_fail("v >= 0 && v < p->nObjs",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/gia.h"
                            ,0x1a3,"Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)");
            }
            pGVar11 = pGVar3 + uVar24;
          }
          if ((pGVar11 != (Gia_Obj_t *)0x0) && (uVar24 = pGVar11->Value, uVar24 != 0xffffffff)) {
            uVar21 = (uint)*(undefined8 *)(puVar8 + -2);
            if ((-1 < (int)uVar21) &&
               ((uVar21 = uVar21 & 0x1fffffff, uVar21 != 0x1fffffff &&
                (uVar21 == ((uint)((ulong)*(undefined8 *)(puVar8 + -2) >> 0x20) & 0x1fffffff))))) {
              __assert_fail("!Gia_ObjIsBuf(pObj)",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/giaDup.c"
                            ,0x46b,"Gia_Man_t *Gia_ManDupMarked(Gia_Man_t *)");
            }
            if (((int)uVar22 < 0) || ((int)uVar24 < 0)) {
LAB_006753cd:
              __assert_fail("Lit >= 0",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/util/abc_global.h"
                            ,0x10c,"int Abc_Lit2Var(int)");
            }
            if (uVar22 >> 1 <= uVar24 >> 1) {
              __assert_fail("Abc_Lit2Var(pObj->Value) > Abc_Lit2Var(pSibl->Value)",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/giaDup.c"
                            ,0x46c,"Gia_Man_t *Gia_ManDupMarked(Gia_Man_t *)");
            }
            piVar14[uVar22 >> 1] = uVar24 >> 1;
          }
        }
        lVar17 = lVar17 + 1;
        puVar8 = puVar8 + 3;
      } while ((int)uVar26 != lVar17);
    }
  }
  return p_00;
}

Assistant:

Gia_Man_t * Gia_ManDupMarked( Gia_Man_t * p )
{
    Gia_Man_t * pNew;
    Gia_Obj_t * pObj;
    int i, nRos = 0, nRis = 0;
    int CountMarked = 0;
    Gia_ManForEachObj( p, pObj, i )
        CountMarked += pObj->fMark0;
    Gia_ManFillValue( p );
    pNew = Gia_ManStart( Gia_ManObjNum(p) - CountMarked );
    if ( p->pMuxes )
        pNew->pMuxes = ABC_CALLOC( unsigned, pNew->nObjsAlloc );
    pNew->nConstrs = p->nConstrs;
    pNew->pName = Abc_UtilStrsav( p->pName );
    pNew->pSpec = Abc_UtilStrsav( p->pSpec );
    Gia_ManConst0(p)->Value = 0;
    Gia_ManForEachObj1( p, pObj, i )
    {
        if ( pObj->fMark0 )
        {
            assert( !Gia_ObjIsBuf(pObj) );
            pObj->fMark0 = 0;
            continue;
        }
        if ( Gia_ObjIsBuf(pObj) )
            pObj->Value = Gia_ManAppendBuf( pNew, Gia_ObjFanin0Copy(pObj) );
        else if ( Gia_ObjIsAnd(pObj) )
        {
            if ( Gia_ObjIsXor(pObj) )
                pObj->Value = Gia_ManAppendXorReal( pNew, Gia_ObjFanin0Copy(pObj), Gia_ObjFanin1Copy(pObj) );
            else if ( Gia_ObjIsMux(p, pObj) )
                pObj->Value = Gia_ManAppendMuxReal( pNew, Gia_ObjFanin2Copy(p, pObj), Gia_ObjFanin1Copy(pObj), Gia_ObjFanin0Copy(pObj) );
            else
                pObj->Value = Gia_ManAppendAnd( pNew, Gia_ObjFanin0Copy(pObj), Gia_ObjFanin1Copy(pObj) );
        }
        else if ( Gia_ObjIsCi(pObj) )
        {
            pObj->Value = Gia_ManAppendCi( pNew );
            nRos += Gia_ObjIsRo(p, pObj);
        }
        else if ( Gia_ObjIsCo(pObj) )
        {
//            Gia_Obj_t * pFanin = Gia_ObjFanin0(pObj);
            pObj->Value = Gia_ManAppendCo( pNew, Gia_ObjFanin0Copy(pObj) );
            nRis += Gia_ObjIsRi(p, pObj);
        }
    }
    assert( pNew->nObjsAlloc == pNew->nObjs );
    assert( nRos == nRis );
    Gia_ManSetRegNum( pNew, nRos );
    if ( p->pReprs && p->pNexts )
    {
        Gia_Obj_t * pRepr;
        pNew->pReprs = ABC_CALLOC( Gia_Rpr_t, Gia_ManObjNum(pNew) );
        for ( i = 0; i < Gia_ManObjNum(p); i++ )
            Gia_ObjSetRepr( pNew, i, GIA_VOID );
        Gia_ManForEachObj1( p, pObj, i )
        {
            if ( !~pObj->Value )
                continue;
            pRepr = Gia_ObjReprObj( p, i );
            if ( pRepr == NULL )
                continue;
            if ( !~pRepr->Value )
                continue;
            assert( !Gia_ObjIsBuf(pObj) );
            if ( Abc_Lit2Var(pObj->Value) != Abc_Lit2Var(pRepr->Value) )
                Gia_ObjSetRepr( pNew, Abc_Lit2Var(pObj->Value), Abc_Lit2Var(pRepr->Value) ); 
        }
        pNew->pNexts = Gia_ManDeriveNexts( pNew );
    }
    if ( Gia_ManHasChoices(p) )
    {
        Gia_Obj_t * pSibl;
        pNew->pSibls = ABC_CALLOC( int, Gia_ManObjNum(pNew) );
        Gia_ManForEachObj1( p, pObj, i )
        {
            if ( !~pObj->Value )
                continue;
            pSibl = Gia_ObjSiblObj( p, i );
            if ( pSibl == NULL )
                continue;
            if ( !~pSibl->Value )
                continue;
            assert( !Gia_ObjIsBuf(pObj) );
            assert( Abc_Lit2Var(pObj->Value) > Abc_Lit2Var(pSibl->Value) );
            pNew->pSibls[Abc_Lit2Var(pObj->Value)] = Abc_Lit2Var(pSibl->Value);
        }
    }
    return pNew;
}